

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * plot_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_float tVar1;
  char cVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  int iVar5;
  t_pd *object;
  _glist *p_Var6;
  t_symbol *ptVar7;
  int iVar8;
  _fielddesc *fd;
  bool bVar9;
  long lStack_80;
  
  object = pd_new(plot_class);
  p_Var6 = canvas_getcurrent();
  object[6] = (t_pd)p_Var6;
  ptVar7 = gensym("x");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2a),ptVar7);
  ptVar7 = gensym("y");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2f),ptVar7);
  ptVar7 = gensym("w");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x34),ptVar7);
  *(undefined2 *)(object + 0x39) = 1;
  *(undefined4 *)(object + 0x3a) = 0x3f800000;
  object[0x3b] = (t_pd)0x0;
  object[0x3c] = (t_pd)0x0;
  *(undefined4 *)(object + 0x3d) = 0;
  *(undefined2 *)(object + 0x3e) = 1;
  *(undefined4 *)(object + 0x3f) = 0x3f800000;
  object[0x40] = (t_pd)0x0;
  object[0x41] = (t_pd)0x0;
  *(undefined4 *)(object + 0x42) = 0;
  *(undefined2 *)(object + 0x43) = 1;
  *(undefined4 *)(object + 0x44) = 0x3f800000;
  *(undefined4 *)(object + 0x47) = 0;
  object[0x45] = (t_pd)0x0;
  object[0x46] = (t_pd)0x0;
  iVar8 = 1;
  do {
    ptVar7 = atom_getsymbolarg(0,argc,argv);
    __s1 = ptVar7->s_name;
    iVar4 = strcmp(__s1,"curve");
    iVar5 = -1;
    lStack_80 = 0x10;
    iVar3 = 2;
    if (iVar4 != 0) {
      cVar2 = *__s1;
      if (cVar2 == '-') {
        if ((__s1[1] == 'c') && (iVar3 = 2, __s1[2] == '\0')) goto LAB_00157d37;
        if ((__s1[1] != 'v') ||
           ((argc < 2 || (fd = (_fielddesc *)(object + 0x39), __s1[2] != '\0')))) goto LAB_00157d02;
      }
      else {
LAB_00157d02:
        bVar9 = argc < 2;
        iVar5 = strcmp(__s1,"-vs");
        if ((bVar9) || (fd = (_fielddesc *)(object + 0x3e), iVar5 != 0)) {
          if (cVar2 != '-') break;
          if (((((__s1[1] != 'x') || (fd = (_fielddesc *)(object + 0x2a), bVar9 || __s1[2] != '\0'))
               && ((__s1[1] != 'y' || (fd = (_fielddesc *)(object + 0x2f), bVar9 || __s1[2] != '\0')
                   ))) &&
              ((__s1[1] != 'w' || (fd = (_fielddesc *)(object + 0x34), bVar9 || __s1[2] != '\0'))))
             && ((__s1[1] != 'e' || (fd = (_fielddesc *)(object + 0x43), bVar9 || __s1[2] != '\0')))
             ) {
            pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,__s1);
            iVar5 = -1;
            lStack_80 = 0x10;
            iVar3 = iVar8;
            goto LAB_00157d37;
          }
        }
      }
      fielddesc_setfloatarg(fd,1,argv + 1);
      iVar5 = -2;
      lStack_80 = 0x20;
      iVar3 = iVar8;
    }
LAB_00157d37:
    iVar8 = iVar3;
    argc = argc + iVar5;
    argv = (t_atom *)((long)&argv->a_type + lStack_80);
  } while( true );
  if (argc == 0) {
    *(undefined2 *)(object + 0x25) = 1;
    *(undefined4 *)(object + 0x26) = 0x3f800000;
    object[0x27] = (t_pd)0x0;
    object[0x28] = (t_pd)0x0;
    *(undefined4 *)(object + 0x29) = 0;
LAB_00157f5c:
    *(undefined2 *)(object + 7) = 1;
    *(undefined4 *)(object + 8) = 0;
    object[9] = (t_pd)0x0;
    object[10] = (t_pd)0x0;
    *(undefined4 *)(object + 0xb) = 0;
LAB_00157f71:
    *(undefined2 *)(object + 0xc) = 1;
    *(undefined4 *)(object + 0xd) = 0x3f800000;
    object[0xe] = (t_pd)0x0;
    object[0xf] = (t_pd)0x0;
    *(undefined4 *)(object + 0x10) = 0;
LAB_00157f8c:
    *(undefined2 *)(object + 0x11) = 1;
    *(undefined4 *)(object + 0x12) = 0x3f800000;
    object[0x13] = (t_pd)0x0;
    object[0x14] = (t_pd)0x0;
    *(undefined4 *)(object + 0x15) = 0;
LAB_00157fb0:
    *(undefined2 *)(object + 0x16) = 1;
    *(undefined4 *)(object + 0x17) = 0x3f800000;
    object[0x18] = (t_pd)0x0;
    object[0x19] = (t_pd)0x0;
    *(undefined4 *)(object + 0x1a) = 0;
  }
  else {
    if (argc < 1) {
      *(undefined2 *)(object + 0x25) = 1;
      *(undefined4 *)(object + 0x26) = 0;
      object[0x27] = (t_pd)0x0;
      object[0x28] = (t_pd)0x0;
      *(undefined4 *)(object + 0x29) = 0;
    }
    else {
      if (argv->a_type == A_SYMBOL) {
        *(undefined2 *)(object + 0x25) = 0x137;
        *(word *)(object + 0x26) = argv->a_w;
      }
      else {
        tVar1 = (argv->a_w).w_float;
        *(undefined2 *)(object + 0x25) = 1;
        *(t_float *)(object + 0x26) = tVar1;
        object[0x27] = (t_pd)0x0;
        object[0x28] = (t_pd)0x0;
        *(undefined4 *)(object + 0x29) = 0;
      }
      if (argc + -1 == 0) goto LAB_00157f5c;
    }
    fielddesc_setfloatarg((_fielddesc *)(object + 7),argc + -1,argv + 1);
    if (argc + -2 == 0) goto LAB_00157f71;
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argc + -2,argv + 2);
    if (argc + -3 == 0) goto LAB_00157f8c;
    fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argc + -3,argv + 3);
    if (argc + -4 == 0) goto LAB_00157fb0;
    fielddesc_setfloatarg((_fielddesc *)(object + 0x16),argc + -4,argv + 4);
    if (argc + -5 != 0) {
      fielddesc_setfloatarg((_fielddesc *)(object + 0x1b),argc + -5,argv + 5);
      if (argc + -6 != 0) {
        fielddesc_setfloatarg((_fielddesc *)(object + 0x20),argc + -6,argv + 6);
        return object;
      }
      goto LAB_00157ff8;
    }
  }
  *(undefined2 *)(object + 0x1b) = 1;
  *(undefined4 *)(object + 0x1c) = 0x3f800000;
  object[0x1d] = (t_pd)0x0;
  object[0x1e] = (t_pd)0x0;
  *(undefined4 *)(object + 0x1f) = 0;
LAB_00157ff8:
  *(undefined2 *)(object + 0x20) = 1;
  *(float *)(object + 0x21) = (float)iVar8;
  object[0x22] = (t_pd)0x0;
  object[0x23] = (t_pd)0x0;
  *(undefined4 *)(object + 0x24) = 0;
  return object;
}

Assistant:

static void *plot_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_plot *x = (t_plot *)pd_new(plot_class);
    int defstyle = PLOTSTYLE_POLY;
    x->x_canvas = canvas_getcurrent();

    fielddesc_setfloat_var(&x->x_xpoints, gensym("x"));
    fielddesc_setfloat_var(&x->x_ypoints, gensym("y"));
    fielddesc_setfloat_var(&x->x_wpoints, gensym("w"));

    fielddesc_setfloat_const(&x->x_vis, 1);
    fielddesc_setfloat_const(&x->x_scalarvis, 1);
    fielddesc_setfloat_const(&x->x_edit, 1);
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "curve") ||
            !strcmp(firstarg->s_name, "-c"))
        {
            defstyle = PLOTSTYLE_BEZ;
            argc--, argv++;
        }
        else if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-vs") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_scalarvis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-x") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_xpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-y") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_ypoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-w") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_wpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-e") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_edit, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (*firstarg->s_name == '-')
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                firstarg->s_name);
            argc--; argv++;
        }
        else break;
    }
    if (argc) fielddesc_setarrayarg(&x->x_data, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_data, 1);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xinc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xinc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_style, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_style, defstyle);
    return (x);
}